

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smallft.c
# Opt level: O0

void drft_forward(drft_lookup *l,float *data)

{
  float *data_local;
  drft_lookup *l_local;
  
  if (l->n != 1) {
    drftf1(l->n,data,l->trigcache,l->trigcache + l->n,l->splitcache);
  }
  return;
}

Assistant:

void drft_forward(drft_lookup *l,float *data){
  if(l->n==1)return;
  drftf1(l->n,data,l->trigcache,l->trigcache+l->n,l->splitcache);
}